

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  uint uVar2;
  Op *pOVar3;
  uint uVar4;
  int *p_00;
  byte bVar5;
  uint uVar6;
  
  uVar4 = *pMaxFuncArgs;
  p_00 = p->aLabel;
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a | 0x100;
  if (0 < p->nOp) {
    pOVar3 = p->aOp;
    uVar2 = p->nOp + 1;
    do {
      bVar1 = pOVar3->opcode;
      bVar5 = ""[bVar1];
      pOVar3->opflags = bVar5;
      if (bVar1 < 0x5f) {
        if (bVar1 < 0x51) {
          if (bVar1 == 0x12) {
LAB_001745bb:
            if ((int)uVar4 <= (int)(uint)pOVar3->p5) {
              uVar4 = (uint)pOVar3->p5;
            }
          }
          else if ((bVar1 == 0x23) && (pOVar3->p2 != 0)) goto LAB_0017458f;
        }
        else {
          if (bVar1 == 0x51) goto LAB_001745c9;
          if (bVar1 == 0x5c) {
            (pOVar3->p4).p = sqlite3BtreePrevious;
            goto LAB_001745cd;
          }
        }
      }
      else if (bVar1 < 0x7f) {
        if (bVar1 == 0x5f) {
LAB_001745c9:
          (pOVar3->p4).p = sqlite3BtreeNext;
LAB_001745cd:
          pOVar3->p4type = -0x13;
        }
        else if (bVar1 == 0x7b) goto LAB_001745bb;
      }
      else if (bVar1 == 0x7f) {
LAB_0017458f:
        p->field_0x9b = p->field_0x9b & 0xfe;
        bVar5 = pOVar3->opflags;
      }
      else {
        if (bVar1 == 0x88) {
          uVar6 = pOVar3[-1].p1;
        }
        else {
          if (bVar1 != 0x8c) goto LAB_001745de;
          uVar6 = pOVar3->p2;
        }
        if ((int)uVar4 < (int)uVar6) {
          uVar4 = uVar6;
        }
      }
LAB_001745de:
      if (((bVar5 & 1) != 0) && (pOVar3->p2 < 0)) {
        pOVar3->p2 = p_00[(uint)~pOVar3->p2];
      }
      pOVar3 = pOVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    p_00 = p->aLabel;
  }
  sqlite3DbFree(p->db,p_00);
  p->aLabel = (int *)0x0;
  *pMaxFuncArgs = uVar4;
  return;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  int *aLabel = p->aLabel;
  p->readOnly = 1;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( opcode==OP_Function || opcode==OP_AggStep ){
      if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
    }else if( (opcode==OP_Transaction && pOp->p2!=0) || opcode==OP_Vacuum ){
      p->readOnly = 0;
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( opcode==OP_VUpdate ){
      if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
    }else if( opcode==OP_VFilter ){
      int n;
      assert( p->nOp - i >= 3 );
      assert( pOp[-1].opcode==OP_Integer );
      n = pOp[-1].p1;
      if( n>nMaxArgs ) nMaxArgs = n;
#endif
    }else if( opcode==OP_Next || opcode==OP_SorterNext ){
      pOp->p4.xAdvance = sqlite3BtreeNext;
      pOp->p4type = P4_ADVANCE;
    }else if( opcode==OP_Prev ){
      pOp->p4.xAdvance = sqlite3BtreePrevious;
      pOp->p4type = P4_ADVANCE;
    }

    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<p->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, p->aLabel);
  p->aLabel = 0;

  *pMaxFuncArgs = nMaxArgs;
}